

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbirb.cpp
# Opt level: O0

BreakIterator *
icu_63::RBBIRuleBuilder::createRuleBasedBreakIterator
          (UnicodeString *rules,UParseError *parseError,UErrorCode *status)

{
  UBool UVar1;
  RBBIDataHeader *data_00;
  RuleBasedBreakIterator *this;
  UVector *size;
  RuleBasedBreakIterator *local_130;
  RuleBasedBreakIterator *local_108;
  RuleBasedBreakIterator *This;
  RBBIDataHeader *data;
  undefined1 local_e8 [8];
  RBBIRuleBuilder builder;
  UErrorCode *status_local;
  UParseError *parseError_local;
  UnicodeString *rules_local;
  
  builder.fRuleStatusVals = (UVector *)status;
  RBBIRuleBuilder((RBBIRuleBuilder *)local_e8,rules,parseError,status);
  UVar1 = ::U_FAILURE(*(UErrorCode *)&((builder.fRuleStatusVals)->super_UObject)._vptr_UObject);
  if (UVar1 == '\0') {
    size = builder.fRuleStatusVals;
    data_00 = build((RBBIRuleBuilder *)local_e8,(UErrorCode *)builder.fRuleStatusVals);
    UVar1 = ::U_FAILURE(*(UErrorCode *)&((builder.fRuleStatusVals)->super_UObject)._vptr_UObject);
    if (UVar1 == '\0') {
      this = (RuleBasedBreakIterator *)UMemory::operator_new((UMemory *)0x280,(size_t)size);
      local_130 = (RuleBasedBreakIterator *)0x0;
      if (this != (RuleBasedBreakIterator *)0x0) {
        RuleBasedBreakIterator::RuleBasedBreakIterator
                  (this,data_00,(UErrorCode *)builder.fRuleStatusVals);
        local_130 = this;
      }
      local_108 = local_130;
      UVar1 = ::U_FAILURE(*(UErrorCode *)&((builder.fRuleStatusVals)->super_UObject)._vptr_UObject);
      if (UVar1 == '\0') {
        if (local_130 == (RuleBasedBreakIterator *)0x0) {
          *(undefined4 *)&((builder.fRuleStatusVals)->super_UObject)._vptr_UObject = 7;
        }
      }
      else {
        if (local_130 != (RuleBasedBreakIterator *)0x0) {
          (*(local_130->super_BreakIterator).super_UObject._vptr_UObject[1])();
        }
        local_108 = (RuleBasedBreakIterator *)0x0;
      }
      rules_local = (UnicodeString *)local_108;
    }
    else {
      rules_local = (UnicodeString *)0x0;
    }
  }
  else {
    rules_local = (UnicodeString *)0x0;
  }
  ~RBBIRuleBuilder((RBBIRuleBuilder *)local_e8);
  return (BreakIterator *)rules_local;
}

Assistant:

BreakIterator *
RBBIRuleBuilder::createRuleBasedBreakIterator( const UnicodeString    &rules,
                                    UParseError      *parseError,
                                    UErrorCode       &status)
{
    //
    // Read the input rules, generate a parse tree, symbol table,
    // and list of all Unicode Sets referenced by the rules.
    //
    RBBIRuleBuilder  builder(rules, parseError, status);
    if (U_FAILURE(status)) { // status checked here bcos build below doesn't
        return NULL;
    }

    RBBIDataHeader *data = builder.build(status);

    if (U_FAILURE(status)) {
        return nullptr;
    }

    //
    //  Create a break iterator from the compiled rules.
    //     (Identical to creation from stored pre-compiled rules)
    //
    // status is checked after init in construction.
    RuleBasedBreakIterator *This = new RuleBasedBreakIterator(data, status);
    if (U_FAILURE(status)) {
        delete This;
        This = NULL;
    } 
    else if(This == NULL) { // test for NULL
        status = U_MEMORY_ALLOCATION_ERROR;
    }
    return This;
}